

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  undefined4 *puVar1;
  curl_slist *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  _Bool *p_Var6;
  char *fmt;
  char *pcVar7;
  SessionHandle *data;
  SessionHandle *pSVar8;
  char *local_40;
  
  *done = false;
  pSVar8 = conn->data;
  pcVar7 = (pSVar8->set).str[4];
  if (pcVar7 != (char *)0x0) {
    CVar3 = Curl_urldecode(pSVar8,pcVar7,0,(char **)((long)(pSVar8->req).protop + 8),(size_t *)0x0,
                           true);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pSVar8 = conn->data;
  }
  (pSVar8->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar8,0);
  Curl_pgrsSetDownloadCounter(pSVar8,0);
  Curl_pgrsSetUploadSize(pSVar8,-1);
  Curl_pgrsSetDownloadSize(pSVar8,-1);
  pSVar8 = conn->data;
  puVar1 = (undefined4 *)(pSVar8->req).protop;
  if ((pSVar8->set).opt_no_body == true) {
    *puVar1 = 1;
  }
  *done = false;
  pcVar2 = (pSVar8->set).mail_rcpt;
  *(curl_slist **)(puVar1 + 4) = pcVar2;
  if ((pcVar2 != (curl_slist *)0x0 & (pSVar8->set).upload) != 1) {
    CVar3 = smtp_perform_command(conn);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    goto LAB_0049cb65;
  }
  pcVar7 = (pSVar8->set).str[0x25];
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (*Curl_cstrdup)("<>");
  }
  else {
    if (*pcVar7 == '<') {
      pcVar7 = "%s";
    }
    else {
      pcVar7 = "<%s>";
    }
    pcVar7 = curl_maprintf(pcVar7);
  }
  if (pcVar7 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar4 = (pSVar8->set).str[0x26];
  if ((pcVar4 == (char *)0x0) || (*(int *)((long)&conn->proto + 0x94) == 0)) {
    pcVar4 = (char *)0x0;
  }
  else {
    if (*pcVar4 == '\0') {
      pcVar4 = (*Curl_cstrdup)("<>");
    }
    else {
      pcVar4 = curl_maprintf("%s");
    }
    if (pcVar4 == (char *)0x0) {
      (*Curl_cfree)(pcVar7);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pp = &conn->proto;
  if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (conn->data->state).infilesize)) {
    local_40 = curl_maprintf("%ld",(pSVar8->state).infilesize);
    if (local_40 == (char *)0x0) {
      (*Curl_cfree)(pcVar7);
      (*Curl_cfree)(pcVar4);
      return CURLE_OUT_OF_MEMORY;
    }
    if (pcVar4 == (char *)0x0) {
      fmt = "MAIL FROM:%s SIZE=%s";
      pcVar5 = local_40;
LAB_0049cb14:
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,fmt,pcVar7,pcVar5);
    }
    else {
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s SIZE=%s",pcVar7,pcVar4,local_40);
    }
  }
  else {
    if (pcVar4 != (char *)0x0) {
      fmt = "MAIL FROM:%s AUTH=%s";
      local_40 = (char *)0x0;
      pcVar5 = pcVar4;
      goto LAB_0049cb14;
    }
    local_40 = (char *)0x0;
    CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s",pcVar7);
  }
  (*Curl_cfree)(pcVar7);
  (*Curl_cfree)(pcVar4);
  (*Curl_cfree)(local_40);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  (conn->proto).imapc.state = IMAP_SELECT;
LAB_0049cb65:
  p_Var6 = done;
  CVar3 = smtp_multi_statemach(conn,done);
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    if (*done == true) {
      smtp_dophase_done(conn,SUB81(p_Var6,0));
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}